

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall cppcms::http::context::on_request_ready(context *this,bool error)

{
  _data *p_Var1;
  application *this_00;
  undefined7 in_register_00000031;
  intrusive_ptr<cppcms::application> local_90;
  shared_ptr<cppcms::http::context> local_88;
  context_guard g;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_38 [2];
  
  p_Var1 = (this->d).ptr_;
  local_38[0]._M_ptr =
       (p_Var1->pool).
       super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38[0]._M_refcount._M_pi =
       (p_Var1->pool).
       super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->d).ptr_;
  this_00 = (p_Var1->app).p_;
  (p_Var1->app).p_ = (application *)0x0;
  local_90.p_ = this_00;
  if ((int)CONCAT71(in_register_00000031,error) == 0) {
    if (this_00 == (application *)0x0) {
      std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,local_38);
      submit_to_pool_internal
                (this,(shared_ptr<cppcms::application_specific_pool> *)&local_48,
                 &((this->d).ptr_)->matched,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    else {
      std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppcms::http::context,void>
                ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this);
      application::assign_context(this_00,&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      dispatch(&local_90,&((this->d).ptr_)->matched,false);
    }
  }
  else if (this_00 != (application *)0x0) {
    anon_unknown_3::context_guard::context_guard(&g,this_00,this);
    http::request::on_error(&((this->d).ptr_)->request);
    anon_unknown_3::context_guard::~context_guard(&g);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38[0]._M_refcount);
  return;
}

Assistant:

void context::on_request_ready(bool error)
{
	booster::shared_ptr<application_specific_pool> pool;
	booster::intrusive_ptr<application> app;
	pool.swap(d->pool);
	app.swap(d->app);

	if(error) {
		if(app) {
			try {
				context_guard g(app.get(),*this);
				request().on_error();
			}
			catch(std::exception const &e) {
				BOOSTER_ERROR("cppcms") << "exception at request::on_error" << e.what() << booster::trace(e);
			}
			catch(...) {
				BOOSTER_ERROR("cppcms") << "Unknown exception at request::on_error";
			}
		}
		return;
	}

	if(app) {
		app->assign_context(self());
		dispatch(app,d->matched,false);
		return;
	}

	submit_to_pool_internal(pool,d->matched,true);
}